

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::LineBufferTask::LineBufferTask
          (LineBufferTask *this,TaskGroup *group,Data *ofd,int number,int scanLineMin,
          int scanLineMax)

{
  LineBuffer *pLVar1;
  char *pcVar2;
  int *piVar3;
  uint in_ECX;
  undefined8 in_RDX;
  TaskGroup *in_RSI;
  void *__stat_loc;
  Task *in_RDI;
  Data *in_stack_ffffffffffffffc0;
  int local_38 [5];
  int local_24;
  int local_20;
  uint local_1c;
  undefined8 local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  IlmThread_2_5::Task::Task(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__LineBufferTask_0340e550;
  *(undefined8 *)(in_RDI + 0x10) = local_18;
  __stat_loc = (void *)(ulong)local_1c;
  pLVar1 = OutputFile::Data::getLineBuffer
                     (in_stack_ffffffffffffffc0,(int)((ulong)(in_RDI + 0x18) >> 0x20));
  *(LineBuffer **)(in_RDI + 0x18) = pLVar1;
  LineBuffer::wait(*(LineBuffer **)(in_RDI + 0x18),__stat_loc);
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x40) & 1) == 0) {
    pcVar2 = Array::operator_cast_to_char_(*(Array **)(in_RDI + 0x18));
    *(char **)(*(long *)(in_RDI + 0x18) + 0x20) = pcVar2;
    *(uint *)(*(long *)(in_RDI + 0x18) + 0x28) =
         *(int *)(*(long *)(in_RDI + 0x10) + 0x8c) +
         local_1c * *(int *)(*(long *)(in_RDI + 0x10) + 0x120);
    local_38[0] = *(int *)(*(long *)(in_RDI + 0x18) + 0x28) +
                  *(int *)(*(long *)(in_RDI + 0x10) + 0x120) + -1;
    piVar3 = std::min<int>(local_38,(int *)(*(long *)(in_RDI + 0x10) + 0x90));
    *(int *)(*(long *)(in_RDI + 0x18) + 0x2c) = *piVar3;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + 0x40) = 1;
  }
  piVar3 = std::max<int>((int *)(*(long *)(in_RDI + 0x18) + 0x28),&local_20);
  *(int *)(*(long *)(in_RDI + 0x18) + 0x30) = *piVar3;
  piVar3 = std::min<int>((int *)(*(long *)(in_RDI + 0x18) + 0x2c),&local_24);
  *(int *)(*(long *)(in_RDI + 0x18) + 0x34) = *piVar3;
  return;
}

Assistant:

LineBufferTask::LineBufferTask
    (TaskGroup *group,
     OutputFile::Data *ofd,
     int number,
     int scanLineMin,
     int scanLineMax)
:
    Task (group),
    _ofd (ofd),
    _lineBuffer (_ofd->getLineBuffer(number))
{
    //
    // Wait for the lineBuffer to become available
    //

    _lineBuffer->wait ();
    
    //
    // Initialize the lineBuffer data if necessary
    //

    if (!_lineBuffer->partiallyFull)
    {
        _lineBuffer->endOfLineBufferData = _lineBuffer->buffer;

        _lineBuffer->minY = _ofd->minY + number * _ofd->linesInBuffer;

        _lineBuffer->maxY = min (_lineBuffer->minY + _ofd->linesInBuffer - 1,
				 _ofd->maxY);

        _lineBuffer->partiallyFull = true;
    }
    
    _lineBuffer->scanLineMin = max (_lineBuffer->minY, scanLineMin);
    _lineBuffer->scanLineMax = min (_lineBuffer->maxY, scanLineMax);
}